

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

OutputInfo * __thiscall cmGeneratorTarget::GetOutputInfo(cmGeneratorTarget *this,string *config)

{
  OutputInfo *this_00;
  bool bVar1;
  TargetType targetType;
  string *psVar2;
  ulong uVar3;
  pointer ppVar4;
  cmake *this_01;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_OutputInfo>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator<char> local_221;
  string local_220;
  _Base_ptr local_200;
  undefined1 local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1f0;
  undefined1 local_1e0 [8];
  value_type entry;
  OutputInfo info;
  _Self local_f8;
  iterator i;
  undefined1 local_d0 [8];
  string config_upper;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string msg;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  msg.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    return (OutputInfo *)(cmGeneratorTarget *)0x0;
  }
  bVar1 = HaveWellDefinedOutputFiles(this);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_70,"cmGeneratorTarget::GetOutputInfo called for ");
    psVar2 = GetName_abi_cxx11_(this);
    cmAlphaNum::cmAlphaNum(&local_a0,psVar2);
    targetType = GetType(this);
    psVar2 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    cmStrCat<char[17],std::__cxx11::string>
              ((string *)local_40,&local_70,&local_a0,(char (*) [17])" which has type ",psVar2);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    return (OutputInfo *)(cmGeneratorTarget *)0x0;
  }
  std::__cxx11::string::string((string *)local_d0);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::UpperCase((string *)&i,(string *)msg.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_d0,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
  }
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
       ::find(&this->OutputInfoMap,(key_type *)local_d0);
  info.PdbDir.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
       ::end(&this->OutputInfoMap);
  bVar1 = std::operator==(&local_f8,(_Self *)((long)&info.PdbDir.field_2 + 8));
  if (bVar1) {
    this_00 = (OutputInfo *)((long)&entry.second.PdbDir.field_2 + 8);
    OutputInfo::OutputInfo(this_00);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::OutputInfo_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
                *)local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,this_00
              );
    _Var5 = std::
            map<std::__cxx11::string,cmGeneratorTarget::OutputInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
            ::insert<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>&>
                      ((map<std::__cxx11::string,cmGeneratorTarget::OutputInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
                        *)&this->OutputInfoMap,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
                        *)local_1e0);
    local_200 = (_Base_ptr)_Var5.first._M_node;
    local_1f8 = _Var5.second;
    local_1f0._M_allocated_capacity = (size_type)local_200;
    local_1f0._M_local_buf[8] = local_1f8;
    local_f8._M_node = local_200;
    ComputeOutputDir(this,(string *)msg.field_2._8_8_,RuntimeBinaryArtifact,
                     (string *)((long)&entry.second.PdbDir.field_2 + 8));
    ComputeOutputDir(this,(string *)msg.field_2._8_8_,ImportLibraryArtifact,
                     (string *)((long)&info.OutDir.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"PDB",&local_221);
    bVar1 = ComputePDBOutputDir(this,&local_220,(string *)msg.field_2._8_8_,
                                (string *)((long)&info.ImpDir.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__cxx11::string::operator=
                ((string *)(info.ImpDir.field_2._M_local_buf + 8),
                 (string *)(entry.second.PdbDir.field_2._M_local_buf + 8));
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>
             ::operator->(&local_f8);
    OutputInfo::operator=(&ppVar4->second,(OutputInfo *)((long)&entry.second.PdbDir.field_2 + 8));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
             *)local_1e0);
    OutputInfo::~OutputInfo((OutputInfo *)((long)&entry.second.PdbDir.field_2 + 8));
  }
  else {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>
             ::operator->(&local_f8);
    bVar1 = OutputInfo::empty(&ppVar4->second);
    if (bVar1) {
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      psVar2 = GetName_abi_cxx11_(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_278 + 0x10),"Target \'",psVar2);
      std::operator+(&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_278 + 0x10),"\' OUTPUT_DIRECTORY depends on itself.");
      GetBacktrace((cmGeneratorTarget *)local_278);
      cmake::IssueMessage(this_01,FATAL_ERROR,&local_248,(cmListFileBacktrace *)local_278);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_278);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)(local_278 + 0x10));
      this_local = (cmGeneratorTarget *)0x0;
      goto LAB_006ce56c;
    }
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>
           ::operator->(&local_f8);
  this_local = (cmGeneratorTarget *)&ppVar4->second;
LAB_006ce56c:
  std::__cxx11::string::~string((string *)local_d0);
  return (OutputInfo *)this_local;
}

Assistant:

cmGeneratorTarget::OutputInfo const* cmGeneratorTarget::GetOutputInfo(
  const std::string& config) const
{
  // There is no output information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  // Only libraries and executables have well-defined output files.
  if (!this->HaveWellDefinedOutputFiles()) {
    std::string msg = cmStrCat("cmGeneratorTarget::GetOutputInfo called for ",
                               this->GetName(), " which has type ",
                               cmState::GetTargetTypeName(this->GetType()));
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the output information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  auto i = this->OutputInfoMap.find(config_upper);
  if (i == this->OutputInfoMap.end()) {
    // Add empty info in map to detect potential recursion.
    OutputInfo info;
    OutputInfoMapType::value_type entry(config_upper, info);
    i = this->OutputInfoMap.insert(entry).first;

    // Compute output directories.
    this->ComputeOutputDir(config, cmStateEnums::RuntimeBinaryArtifact,
                           info.OutDir);
    this->ComputeOutputDir(config, cmStateEnums::ImportLibraryArtifact,
                           info.ImpDir);
    if (!this->ComputePDBOutputDir("PDB", config, info.PdbDir)) {
      info.PdbDir = info.OutDir;
    }

    // Now update the previously-prepared map entry.
    i->second = info;
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_DIRECTORY depends on itself.",
      this->GetBacktrace());
    return nullptr;
  }
  return &i->second;
}